

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[10],unsigned_long,char_const(&)[23]>
          (String *__return_storage_ptr__,kj *this,char (*params) [10],unsigned_long *params_1,
          char (*params_2) [23])

{
  char (*value) [10];
  unsigned_long *value_00;
  char (*value_01) [23];
  ArrayPtr<const_char> local_70;
  CappedArray<char,_26UL> local_60;
  ArrayPtr<const_char> local_38;
  char (*local_28) [23];
  char (*params_local_2) [23];
  unsigned_long *params_local_1;
  char (*params_local) [10];
  
  local_28 = (char (*) [23])params_1;
  params_local_2 = (char (*) [23])params;
  params_local_1 = (unsigned_long *)this;
  params_local = (char (*) [10])__return_storage_ptr__;
  value = ::const((char (*) [10])this);
  local_38 = toCharSequence<char_const(&)[10]>(value);
  value_00 = fwd<unsigned_long>((NoInfer<unsigned_long> *)params_local_2);
  toCharSequence<unsigned_long>(&local_60,value_00);
  value_01 = ::const(local_28);
  local_70 = toCharSequence<char_const(&)[23]>(value_01);
  _::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,(ArrayPtr<const_char> *)&local_60,
             (CappedArray<char,_26UL> *)&local_70,(ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}